

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
edition_unittest::TestFieldOrderings::_InternalSerialize
          (TestFieldOrderings *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  TestFieldOrderings_NestedMessage *value;
  bool bVar1;
  int cached_size;
  uint32_t *puVar2;
  int64_t value_00;
  TestFieldOrderings *pTVar3;
  WireFormatLite *this_00;
  size_type sVar4;
  uint8_t *target_00;
  UnknownFieldSet *unknown_fields;
  EpsCopyOutputStream *pEVar5;
  float value_01;
  string_view field_name;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined1 local_40 [8];
  string_view _s;
  uint32_t cached_has_bits;
  TestFieldOrderings *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestFieldOrderings *this_local;
  
  _s._M_str._4_4_ = 0;
  puVar2 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  _s._M_str._4_4_ = *puVar2;
  stream_local = (EpsCopyOutputStream *)target;
  if ((_s._M_str._4_4_ & 4) != 0) {
    value_00 = _internal_my_int(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<1>
                             (stream,value_00,target);
  }
  pTVar3 = default_instance();
  pEVar5 = stream;
  stream_local = (EpsCopyOutputStream *)
                 google::protobuf::internal::ExtensionSet::_InternalSerialize
                           (&(this->field_0)._impl_._extensions_,(MessageLite *)pTVar3,2,0xb,
                            (uint8_t *)stream_local,stream);
  if ((_s._M_str._4_4_ & 1) != 0) {
    _local_40 = _internal_my_string(this);
    this_00 = (WireFormatLite *)
              std::basic_string_view<char,_std::char_traits<char>_>::data
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_50,"edition_unittest.TestFieldOrderings.my_string");
    field_name._M_str = (char *)pEVar5;
    field_name._M_len = (size_t)local_50._M_str;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (this_00,(char *)(sVar4 & 0xffffffff),1,(Operation)local_50._M_len,field_name);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,0xb,_local_40,(uint8_t *)stream_local);
  }
  pTVar3 = default_instance();
  stream_local = (EpsCopyOutputStream *)
                 google::protobuf::internal::ExtensionSet::_InternalSerialize
                           (&(this->field_0)._impl_._extensions_,(MessageLite *)pTVar3,0xc,0x65,
                            (uint8_t *)stream_local,stream);
  if ((_s._M_str._4_4_ & 8) != 0) {
    target_00 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    value_01 = _internal_my_float(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteFloatToArray
                             (0x65,value_01,target_00);
  }
  if ((_s._M_str._4_4_ & 2) != 0) {
    value = (this->field_0)._impl_.optional_nested_message_;
    cached_size = TestFieldOrderings_NestedMessage::GetCachedSize
                            ((this->field_0)._impl_.optional_nested_message_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (200,(MessageLite *)value,cached_size,(uint8_t *)stream_local,stream);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestFieldOrderings::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestFieldOrderings& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestFieldOrderings)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int64 my_int = 1;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<1>(
            stream, this_._internal_my_int(), target);
  }

  // Extension range [2, 11)
  target = this_._impl_._extensions_._InternalSerialize(
      &default_instance(), 2, 11, target, stream);
  // string my_string = 11;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::absl::string_view _s = this_._internal_my_string();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestFieldOrderings.my_string");
    target = stream->WriteStringMaybeAliased(11, _s, target);
  }

  // Extension range [12, 101)
  target = this_._impl_._extensions_._InternalSerialize(
      &default_instance(), 12, 101, target, stream);
  // float my_float = 101;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFloatToArray(
        101, this_._internal_my_float(), target);
  }

  // .edition_unittest.TestFieldOrderings.NestedMessage optional_nested_message = 200;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        200, *this_._impl_.optional_nested_message_, this_._impl_.optional_nested_message_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestFieldOrderings)
  return target;
}